

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::redirect<httplib::ClientImpl>
               (ClientImpl *cli,Request *req,Response *res,string *path,string *location,
               Error *error)

{
  bool bVar1;
  ulong uVar2;
  int __flags;
  undefined1 local_380 [7];
  bool ret;
  Response new_res;
  undefined1 local_268 [8];
  Request new_req;
  Error *error_local;
  string *location_local;
  string *path_local;
  Response *res_local;
  Request *req_local;
  ClientImpl *cli_local;
  
  __flags = (int)location;
  new_req.authorization_count_ = (size_t)error;
  Request::Request((Request *)local_268,req);
  std::__cxx11::string::operator=
            ((string *)(new_req.method.field_2._M_local_buf + 8),(string *)path);
  new_req.progress._M_invoker = new_req.progress._M_invoker + -1;
  if (((res->status == 0x12f) && (bVar1 = std::operator!=(&req->method,"GET"), bVar1)) &&
     (bVar1 = std::operator!=(&req->method,"HEAD"), bVar1)) {
    std::__cxx11::string::operator=((string *)local_268,"GET");
    std::__cxx11::string::clear();
    std::
    multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)((long)&new_req.path.field_2 + 8));
  }
  Response::Response((Response *)local_380);
  uVar2 = ClientImpl::send(cli,(int)local_268,(Response *)local_380,new_req.authorization_count_,
                           __flags);
  if ((uVar2 & 1) != 0) {
    Request::operator=(req,(Request *)local_268);
    Response::operator=(res,(Response *)local_380);
    std::__cxx11::string::operator=((string *)&res->location,(string *)location);
  }
  Response::~Response((Response *)local_380);
  Request::~Request((Request *)local_268);
  return (bool)((byte)uVar2 & 1);
}

Assistant:

inline bool redirect(T &cli, Request &req, Response &res,
                     const std::string &path, const std::string &location,
                     Error &error) {
  Request new_req = req;
  new_req.path = path;
  new_req.redirect_count_ -= 1;

  if (res.status == 303 && (req.method != "GET" && req.method != "HEAD")) {
    new_req.method = "GET";
    new_req.body.clear();
    new_req.headers.clear();
  }

  Response new_res;

  auto ret = cli.send(new_req, new_res, error);
  if (ret) {
    req = new_req;
    res = new_res;
    res.location = location;
  }
  return ret;
}